

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  thread_pool pool;
  future<int> add_future;
  promise<int> add_promise;
  code *local_88 [2];
  code *local_78;
  code *pcStack_70;
  thread_pool local_60;
  __basic_future<int> local_50;
  promise<int> local_40;
  
  ycqian::thread_pool::thread_pool(&local_60,8);
  iVar3 = 10;
  do {
    local_88[0] = (code *)0x0;
    local_88[1] = (code *)0x0;
    pcStack_70 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:21:22)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:21:22)>
               ::_M_manager;
    ycqian::thread_pool::execute(&local_60,(function<void_()> *)local_88);
    if (local_78 != (_Manager_type)0x0) {
      (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_88[1] = (code *)0x0;
  local_88[0] = foo;
  pcStack_70 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_78 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  ycqian::thread_pool::execute(&local_60,(function<void_()> *)local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  local_88[1] = (code *)0x0;
  local_88[0] = bar;
  pcStack_70 = std::_Function_handler<void_(),_int_(*)()>::_M_invoke;
  local_78 = std::_Function_handler<void_(),_int_(*)()>::_M_manager;
  ycqian::thread_pool::execute(&local_60,(function<void_()> *)local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  local_88[1] = (code *)0x0;
  local_88[0] = var;
  pcStack_70 = std::_Function_handler<void_(),_A_(*)()>::_M_invoke;
  local_78 = std::_Function_handler<void_(),_A_(*)()>::_M_manager;
  ycqian::thread_pool::execute(&local_60,(function<void_()> *)local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  uVar4 = 0;
  do {
    local_88[1] = (code *)0x0;
    local_88[0] = (code *)(ulong)uVar4;
    pcStack_70 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:37:22)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:37:22)>
               ::_M_manager;
    ycqian::thread_pool::execute(&local_60,(function<void_()> *)local_88);
    if (local_78 != (_Manager_type)0x0) {
      (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 4);
  local_78 = (_Manager_type)0x0;
  pcStack_70 = (_Invoker_type)0x0;
  local_88[0] = (code *)0x0;
  local_88[1] = (code *)0x0;
  local_88[0] = (code *)operator_new(0x10);
  *(code **)local_88[0] = printf;
  *(char **)((long)local_88[0] + 8) = "msgmsgmsgmsgmsgmsgmsg";
  pcStack_70 = std::
               _Function_handler<void_(),_std::_Bind<int_(*(const_char_*))(const_char_*,_...)>_>::
               _M_invoke;
  local_78 = std::_Function_handler<void_(),_std::_Bind<int_(*(const_char_*))(const_char_*,_...)>_>
             ::_M_manager;
  ycqian::thread_pool::execute(&local_60,(function<void_()> *)local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  local_88[0] = (code *)0x0;
  local_88[1] = (code *)0x5f5e100;
  do {
    iVar3 = nanosleep((timespec *)local_88,(timespec *)local_88);
    if (iVar3 != -1) break;
    piVar1 = __errno_location();
  } while (*piVar1 == 4);
  std::promise<int>::promise(&local_40);
  std::__basic_future<int>::__basic_future(&local_50,&local_40._M_future);
  local_88[1] = (code *)0x0;
  pcStack_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:58:18)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:58:18)>
             ::_M_manager;
  local_88[0] = (code *)&local_40;
  ycqian::thread_pool::execute(&local_60,(function<void_()> *)local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"the result = ",0xd);
  iVar3 = std::future<int>::get((future<int> *)&local_50);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_50._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<int>::~promise(&local_40);
  ycqian::thread_pool::~thread_pool(&local_60);
  return 0;
}

Assistant:

int main(int argc, char **argv){
    ycqian::thread_pool pool(8);

    /**
     * calling lambda expression
     */
    for (int i = 0; i < 10; ++i) {
        pool.execute([] {
            std::cout << std::this_thread::get_id() << " do sth...\n";
        });
    }

    /**
     * calling method
     */
    pool.execute(foo);
    pool.execute(bar);
    pool.execute(var);

    /**
     * passing parameters with lambda expression
     */
    for (int j = 0; j < 4; ++j) {
        pool.execute([j] {
            std::cout << "task-" << j << std::endl;
        });
    }

    /**
     * passing parameters with std::bind
     */
    const char *str = "msgmsgmsgmsgmsgmsgmsg";
    pool.execute(std::bind(printf, str));

    /**
     * wait some time to see the output
     */
    std::this_thread::sleep_for(std::chrono::milliseconds(100));

    /**
     * getting return value
     */
    std::promise<int>add_promise;
    std::future<int> add_future = add_promise.get_future();
    pool.execute([&add_promise] {
        //do some task
        add_promise.set_value(10);
    });
    std::cout << "the result = " << add_future.get() << std::endl;
}